

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinternalmimedata.cpp
# Opt level: O2

QByteArray *
QInternalMimeData::renderDataHelper
          (QByteArray *__return_storage_ptr__,QString *mimeType,QMimeData *data)

{
  qsizetype qVar1;
  PrivateShared *pPVar2;
  bool bVar3;
  char cVar4;
  char *pcVar5;
  long in_FS_OFFSET;
  float fVar6;
  QColor QVar7;
  QArrayDataPointer<char> local_b0;
  QStringView local_98;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 local_78 [12];
  undefined4 uStack_6c;
  QImageData *local_68;
  undefined1 local_58 [40];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char *)0x0;
  (__return_storage_ptr__->d).size = 0;
  local_58._0_8_ = (Data *)0x13;
  local_58._8_8_ = "application/x-color";
  bVar3 = ::operator==(mimeType,(QLatin1StringView *)local_58);
  if (bVar3) {
    QByteArray::resize((longlong)__return_storage_ptr__);
    pcVar5 = QByteArray::data(__return_storage_ptr__);
    uStack_6c = 0xaaaaaaaa;
    QMimeData::colorData();
    QVar7 = qvariant_cast<QColor>((QVariant *)local_58);
    local_78._0_8_ = QVar7._0_8_;
    stack0xffffffffffffff90 = QVar7.ct._4_6_;
    ::QVariant::~QVariant((QVariant *)local_58);
    fVar6 = QColor::redF((QColor *)local_78);
    *(short *)pcVar5 = (short)(int)(fVar6 * 65535.0);
    fVar6 = QColor::greenF((QColor *)local_78);
    *(short *)(pcVar5 + 2) = (short)(int)(fVar6 * 65535.0);
    fVar6 = QColor::blueF((QColor *)local_78);
    *(short *)(pcVar5 + 4) = (short)(int)(fVar6 * 65535.0);
    fVar6 = QColor::alphaF((QColor *)local_78);
    *(short *)(pcVar5 + 6) = (short)(int)(fVar6 * 65535.0);
    goto LAB_002c3b68;
  }
  QMimeData::data((QString *)local_58);
  pPVar2 = (PrivateShared *)(__return_storage_ptr__->d).d;
  pcVar5 = (__return_storage_ptr__->d).ptr;
  (__return_storage_ptr__->d).d = (Data *)local_58._0_8_;
  (__return_storage_ptr__->d).ptr = (char *)local_58._8_8_;
  qVar1 = (__return_storage_ptr__->d).size;
  (__return_storage_ptr__->d).size = local_58._16_8_;
  local_58._0_8_ = pPVar2;
  local_58._8_8_ = pcVar5;
  local_58._16_8_ = qVar1;
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)local_58);
  if ((__return_storage_ptr__->d).size != 0) goto LAB_002c3b68;
  local_58._0_8_ = (PrivateShared *)0x16;
  local_58._8_8_ = "application/x-qt-image";
  bVar3 = ::operator==(mimeType,(QLatin1StringView *)local_58);
  if (bVar3) {
    cVar4 = QMimeData::hasImage();
    if (cVar4 == '\0') goto LAB_002c3a59;
    local_68 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
    local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    stack0xffffffffffffff90 = &DAT_aaaaaaaaaaaaaaaa;
    QMimeData::imageData();
    qvariant_cast<QImage>((QImage *)local_78,(QVariant *)local_58);
    ::QVariant::~QVariant((QVariant *)local_58);
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QBuffer::QBuffer((QBuffer *)local_58,__return_storage_ptr__,(QObject *)0x0);
    QBuffer::open((QBuffer *)local_58,2);
    QImage::save((QImage *)local_78,(QIODevice *)local_58,"PNG",-1);
    QBuffer::~QBuffer((QBuffer *)local_58);
  }
  else {
LAB_002c3a59:
    cVar4 = QString::startsWith((QLatin1String *)mimeType,6);
    if (cVar4 == '\0') goto LAB_002c3b68;
    cVar4 = QMimeData::hasImage();
    if (cVar4 == '\0') goto LAB_002c3b68;
    local_68 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
    local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    stack0xffffffffffffff90 = &DAT_aaaaaaaaaaaaaaaa;
    QMimeData::imageData();
    qvariant_cast<QImage>((QImage *)local_78,(QVariant *)local_58);
    ::QVariant::~QVariant((QVariant *)local_58);
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
    QBuffer::QBuffer((QBuffer *)&local_88,__return_storage_ptr__,(QObject *)0x0);
    QBuffer::open((QBuffer *)&local_88,2);
    local_98.m_data = (mimeType->d).ptr + 6;
    local_98.m_size = (mimeType->d).size + -6;
    QStringView::toLatin1((QByteArray *)&local_b0,&local_98);
    QByteArray::toUpper_helper((QByteArray *)local_58);
    pcVar5 = (char *)local_58._8_8_;
    if ((char *)local_58._8_8_ == (char *)0x0) {
      pcVar5 = (char *)&QByteArray::_empty;
    }
    QImage::save((QImage *)local_78,(QIODevice *)&local_88,pcVar5,-1);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)local_58);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_b0);
    QBuffer::~QBuffer((QBuffer *)&local_88);
  }
  QImage::~QImage((QImage *)local_78);
LAB_002c3b68:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QInternalMimeData::renderDataHelper(const QString &mimeType, const QMimeData *data)
{
    QByteArray ba;
    if (mimeType == "application/x-color"_L1) {
        /* QMimeData can only provide colors as QColor or the name
           of a color as a QByteArray or a QString. So we need to do
           the conversion to application/x-color here.
           The application/x-color format is :
           type: application/x-color
           format: 16
           data[0]: red
           data[1]: green
           data[2]: blue
           data[3]: opacity
        */
        ba.resize(8);
        ushort * colBuf = (ushort *)ba.data();
        QColor c = qvariant_cast<QColor>(data->colorData());
        colBuf[0] = ushort(c.redF() * 0xFFFF);
        colBuf[1] = ushort(c.greenF() * 0xFFFF);
        colBuf[2] = ushort(c.blueF() * 0xFFFF);
        colBuf[3] = ushort(c.alphaF() * 0xFFFF);
    } else {
        ba = data->data(mimeType);
        if (ba.isEmpty()) {
            if (mimeType == "application/x-qt-image"_L1 && data->hasImage()) {
                QImage image = qvariant_cast<QImage>(data->imageData());
                QBuffer buf(&ba);
                buf.open(QBuffer::WriteOnly);
                // would there not be PNG ??
                image.save(&buf, "PNG");
            } else if (auto prefix = "image/"_L1; mimeType.startsWith(prefix) && data->hasImage()) {
                QImage image = qvariant_cast<QImage>(data->imageData());
                QBuffer buf(&ba);
                buf.open(QBuffer::WriteOnly);
                auto type = QStringView{mimeType}.sliced(prefix.size());
                image.save(&buf, type.toLatin1().toUpper().constData());
            }
        }
    }
    return ba;
}